

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TransformFeedback::ArrayElementCase::ArrayElementCase
          (ArrayElementCase *this,Context *context,char *name,char *desc,deUint32 bufferType,
          deUint32 primitiveType,DataType type,Precision precision,Interpolation interpolation)

{
  ProgramSpec *this_00;
  VarType local_60;
  VarType local_48;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TransformFeedbackCase).super_TestCase.m_context = context;
  (this->super_TransformFeedbackCase).m_progSpec.m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_progSpec.m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_bufferMode = bufferType;
  (this->super_TransformFeedbackCase).m_primitiveType = primitiveType;
  (this->super_TransformFeedbackCase).m_inputStride = 0;
  (this->super_TransformFeedbackCase).m_attributes.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_attributes.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_attributes.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_transformFeedbackOutputs.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_transformFeedbackOutputs.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_transformFeedbackOutputs.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_bufferStrides.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_bufferStrides.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_bufferStrides.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_program = (ShaderProgram *)0x0;
  (this->super_TransformFeedbackCase).m_transformFeedback = (TransformFeedback *)0x0;
  (this->super_TransformFeedbackCase).m_outputBuffers.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_outputBuffers.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_outputBuffers.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_TransformFeedbackCase).m_iterNdx = 0;
  (this->super_TransformFeedbackCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TransformFeedbackCase_02187ec0;
  glu::VarType::VarType(&local_60,type,precision);
  glu::VarType::VarType(&local_48,&local_60,3);
  this_00 = &(this->super_TransformFeedbackCase).m_progSpec;
  ProgramSpec::addVarying(this_00,"v_varA",&local_48,interpolation);
  glu::VarType::~VarType(&local_48);
  glu::VarType::~VarType(&local_60);
  glu::VarType::VarType(&local_60,type,precision);
  glu::VarType::VarType(&local_48,&local_60,4);
  ProgramSpec::addVarying(this_00,"v_varB",&local_48,interpolation);
  glu::VarType::~VarType(&local_48);
  glu::VarType::~VarType(&local_60);
  ProgramSpec::addTransformFeedbackVarying(this_00,"v_varA[1]");
  ProgramSpec::addTransformFeedbackVarying(this_00,"v_varB[0]");
  ProgramSpec::addTransformFeedbackVarying(this_00,"v_varB[3]");
  return;
}

Assistant:

ArrayElementCase (Context& context, const char* name, const char* desc, deUint32 bufferType, deUint32 primitiveType, glu::DataType type, glu::Precision precision, Interpolation interpolation)
		: TransformFeedbackCase(context, name, desc, bufferType, primitiveType)
	{
		m_progSpec.addVarying("v_varA", glu::VarType(glu::VarType(type, precision), 3), interpolation);
		m_progSpec.addVarying("v_varB", glu::VarType(glu::VarType(type, precision), 4), interpolation);

		m_progSpec.addTransformFeedbackVarying("v_varA[1]");
		m_progSpec.addTransformFeedbackVarying("v_varB[0]");
		m_progSpec.addTransformFeedbackVarying("v_varB[3]");
	}